

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

void Bmcg_ManStop(Bmcg_Man_t *p)

{
  void *__ptr;
  void **__ptr_00;
  int *piVar1;
  long lVar2;
  
  Gia_ManStopP(&p->pFrames);
  Gia_ManStopP(&p->pClean);
  if (0 < (p->vGia2Fr).nSize) {
    lVar2 = 0;
    do {
      __ptr = (p->vGia2Fr).pArray[lVar2];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vGia2Fr).nSize);
  }
  __ptr_00 = (p->vGia2Fr).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vGia2Fr).pArray = (void **)0x0;
  }
  (p->vGia2Fr).nCap = 0;
  (p->vGia2Fr).nSize = 0;
  piVar1 = (p->vFr2Sat).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFr2Sat).pArray = (int *)0x0;
  }
  (p->vFr2Sat).nCap = 0;
  (p->vFr2Sat).nSize = 0;
  piVar1 = (p->vCiMap).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCiMap).pArray = (int *)0x0;
  }
  (p->vCiMap).nCap = 0;
  (p->vCiMap).nSize = 0;
  if (0 < p->pPars->nProcs) {
    lVar2 = 0;
    do {
      if (p->pSats[lVar2] != (bmcg_sat_solver *)0x0) {
        bmcg_sat_solver_stop(p->pSats[lVar2]);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->pPars->nProcs);
  }
  free(p);
  return;
}

Assistant:

void Bmcg_ManStop( Bmcg_Man_t * p )
{
    int i;
    Gia_ManStopP( &p->pFrames );
    Gia_ManStopP( &p->pClean );
    Vec_PtrFreeData( &p->vGia2Fr );
    Vec_PtrErase( &p->vGia2Fr );
    Vec_IntErase( &p->vFr2Sat );
    Vec_IntErase( &p->vCiMap );
    for ( i = 0; i < p->pPars->nProcs; i++ )
        if ( p->pSats[i] ) 
            bmcg_sat_solver_stop( p->pSats[i] );
    ABC_FREE( p );
}